

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::String::Replace(String *this,int pos,int len,char *s,uchar fill)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  tagbstring t;
  String local_50;
  tagbstring local_40;
  
  if ((this->super_tagbstring).mlen < 1) {
    Replace();
  }
  if (-1 < (len | pos) && s != (char *)0x0) {
    uVar1 = (this->super_tagbstring).slen;
    if (len + pos < (int)uVar1) {
      if ((uint)(*(int *)&(this->super_tagbstring).data - (int)s) < uVar1) {
        String(&local_50,s);
        Replace(this,pos,len,&local_50,fill);
        if (local_50.super_tagbstring.data != (uchar *)0x0) {
          free(local_50.super_tagbstring.data);
        }
      }
      else {
        sVar4 = strlen(s);
        iVar3 = (int)sVar4;
        if ((len < iVar3) &&
           (Alloc(this,(uVar1 - len) + iVar3), (this->super_tagbstring).data == (uchar *)0x0)) {
          return;
        }
        if (iVar3 - len != 0) {
          puVar2 = (this->super_tagbstring).data;
          memmove(puVar2 + (long)iVar3 + (long)pos,puVar2 + (long)len + (long)pos,
                  (long)(this->super_tagbstring).slen - (long)(len + pos));
        }
        memcpy((this->super_tagbstring).data + pos,s,(long)iVar3);
        lVar5 = (long)(iVar3 - len) + (long)(this->super_tagbstring).slen;
        (this->super_tagbstring).slen = (int)lVar5;
        (this->super_tagbstring).data[lVar5] = '\0';
      }
    }
    else {
      local_40.data = (uchar *)s;
      sVar4 = strlen(s);
      local_40.slen = (int)sVar4;
      local_40.mlen = -1;
      iVar3 = bsetstr(&this->super_tagbstring,pos,&local_40,fill);
      if (iVar3 == -1) {
        Replace();
      }
      else {
        iVar3 = (int)((long)pos + (long)local_40.slen);
        if (iVar3 < (this->super_tagbstring).slen) {
          (this->super_tagbstring).slen = iVar3;
          (this->super_tagbstring).data[(long)pos + (long)local_40.slen] = '\0';
        }
      }
    }
  }
  return;
}

Assistant:

void String::Replace(int pos, int len, const char * s, unsigned char fill)
    {
        struct tagbstring t;
        int q;

        if (mlen <= 0)                        bstringThrow("Write protection error");
        if (NULL == s || (pos | len) < 0)    return;


        if (pos + len >= slen)
        {
            cstr2tbstr(t, s);
            if (BSTR_ERR == bsetstr(this, pos, &t, fill))
                bstringThrow("Failure in Replace");
            else if (pos + t.slen < slen)
            {
                slen = pos + t.slen;
                data[slen] = '\0';
            }
        }
        else
        {
            /* Aliasing case */
            if ((unsigned int)(data - (uint8 * ) s) < (unsigned int) slen)
            {
                Replace(pos, len, String(s), fill);
                return;
            }

            if ((q = (int)strlen(s)) > len)
            {
                Alloc(slen + q - len);
                if (NULL == data)    return;
            }
            if (q != len) memmove(data + pos + q, data + pos + len, slen - (pos + len));
            memcpy(data + pos, s, q);
            slen += q - len;
            data[slen] = '\0';
        }
    }